

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

int __thiscall luna::Function::AddChildFunction(Function *this,Function *child)

{
  pointer *pppFVar1;
  iterator __position;
  Function *local_10;
  
  __position._M_current =
       (this->child_funcs_).super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->child_funcs_).super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10 = child;
    std::vector<luna::Function*,std::allocator<luna::Function*>>::
    _M_realloc_insert<luna::Function*const&>
              ((vector<luna::Function*,std::allocator<luna::Function*>> *)&this->child_funcs_,
               __position,&local_10);
  }
  else {
    *__position._M_current = child;
    pppFVar1 = &(this->child_funcs_).
                super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  return (int)((ulong)((long)(this->child_funcs_).
                             super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->child_funcs_).
                            super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int Function::AddChildFunction(Function *child)
    {
        child_funcs_.push_back(child);
        return child_funcs_.size() - 1;
    }